

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int getopt_internal(int nargc,char **nargv,char *options,option *long_options,int *idx,int flags)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int panonopt_end;
  uint short_too;
  int opt_end;
  int iVar6;
  
  if (options == (char *)0x0) {
    return -1;
  }
  if (getopt_internal::posixly_correct == -1) {
    pcVar4 = getenv("POSIXLY_CORRECT");
    getopt_internal::posixly_correct = (int)(pcVar4 != (char *)0x0);
  }
  cVar1 = *options;
  if (getopt_internal::posixly_correct == 0) {
    if (cVar1 != '-') {
      if (cVar1 == '+') goto LAB_001042f3;
      goto LAB_001042f7;
    }
    flags = flags | 2;
LAB_00104313:
    options = options + 1;
  }
  else {
LAB_001042f3:
    flags = flags & 0xfffffffe;
LAB_001042f7:
    if ((cVar1 == '-') || (cVar1 == '+')) goto LAB_00104313;
  }
  if (optind == 0) {
    optreset = 1;
    optind = 1;
LAB_00104379:
    nonopt_end = -1;
    nonopt_start = -1;
    iVar3 = optreset;
  }
  else {
    if (optreset != 0) goto LAB_00104379;
    iVar3 = 0;
  }
  optarg = (char *)0x0;
  pcVar4 = place;
  iVar6 = nonopt_start;
  panonopt_end = nonopt_end;
  while ((opt_end = optind, iVar3 != 0 || (*pcVar4 == '\0'))) {
    optreset = 0;
    if (nargc <= optind) {
      place = "";
      if (panonopt_end == -1) {
        if (iVar6 == -1) {
          nonopt_end = -1;
          nonopt_start = -1;
          optreset = 0;
          return -1;
        }
      }
      else {
        permute_args(iVar6,panonopt_end,optind,nargv);
        iVar6 = (iVar6 - panonopt_end) + optind;
      }
      optind = iVar6;
      nonopt_end = -1;
      nonopt_start = -1;
      return -1;
    }
    pcVar2 = nargv[optind];
    if ((*pcVar2 == '-') &&
       ((cVar1 = pcVar2[1], place = pcVar2, cVar1 != '\0' ||
        (pcVar4 = strchr(options,0x2d), pcVar4 != (char *)0x0)))) {
      if (panonopt_end == -1 && iVar6 != -1) {
        panonopt_end = opt_end;
        nonopt_end = opt_end;
      }
      pcVar4 = pcVar2;
      if (((cVar1 != '\0') && (place = pcVar2 + 1, pcVar4 = place, cVar1 == '-')) &&
         (pcVar2[2] == '\0')) {
        optind = opt_end + 1;
        place = "";
        if (panonopt_end == -1) {
          nonopt_end = -1;
          nonopt_start = -1;
          return -1;
        }
        permute_args(iVar6,panonopt_end,optind,nargv);
        optind = optind + (iVar6 - panonopt_end);
        nonopt_end = -1;
        nonopt_start = -1;
        return -1;
      }
      break;
    }
    place = "";
    if ((flags & 2U) != 0) {
      optind = opt_end + 1;
      optarg = pcVar2;
      return 1;
    }
    if ((flags & 1U) == 0) {
      return -1;
    }
    if (iVar6 == -1) {
      iVar3 = 0;
      iVar6 = opt_end;
      nonopt_start = opt_end;
    }
    else {
      iVar3 = 0;
      if (panonopt_end != -1) {
        permute_args(iVar6,panonopt_end,opt_end,nargv);
        iVar6 = (iVar6 - panonopt_end) + optind;
        nonopt_end = -1;
        opt_end = optind;
        iVar3 = optreset;
        nonopt_start = iVar6;
      }
      panonopt_end = -1;
    }
    optind = opt_end + 1;
    pcVar4 = "";
  }
  if (((long_options != (option *)0x0) && (pcVar4 != nargv[opt_end])) &&
     ((cVar1 = *pcVar4, (flags & 4U) != 0 || (cVar1 == '-')))) {
    short_too = 0;
    if (cVar1 != ':') {
      if (cVar1 == '-') {
        place = pcVar4 + 1;
      }
      else {
        pcVar4 = strchr(options,(int)cVar1);
        short_too = (uint)(pcVar4 != (char *)0x0);
      }
    }
    iVar3 = parse_long_options(nargv,options,long_options,idx,short_too);
    pcVar4 = place;
    if (iVar3 != -1) {
      place = "";
      return iVar3;
    }
  }
  pcVar2 = pcVar4 + 1;
  cVar1 = *pcVar4;
  iVar3 = (int)cVar1;
  place = pcVar2;
  if (cVar1 == ':') {
LAB_001046f6:
    if (*pcVar2 == '\0') {
      optind = optind + 1;
    }
LAB_00104702:
    if ((opterr != 0) && (*options != ':')) {
      warnx("unknown option -- %c",iVar3);
    }
    optopt = iVar3;
    return 0x3f;
  }
  if (cVar1 == '-') {
    if (*pcVar2 != '\0') goto LAB_00104702;
    pcVar4 = strchr(options,iVar3);
    if (pcVar4 == (char *)0x0) {
      return -1;
    }
  }
  else {
    pcVar4 = strchr(options,iVar3);
    if (pcVar4 == (char *)0x0) {
      if (cVar1 == '-') {
        if (*pcVar2 == '\0') {
          return -1;
        }
        goto LAB_00104702;
      }
      goto LAB_001046f6;
    }
    if (((long_options != (option *)0x0) && (cVar1 == 'W')) && (pcVar4[1] == ';')) {
      if (*pcVar2 != '\0') {
LAB_00104695:
        iVar3 = parse_long_options(nargv,options,long_options,idx,0);
        place = "";
        return iVar3;
      }
      lVar5 = (long)optind;
      optind = optind + 1;
      if (optind < nargc) {
        place = nargv[lVar5 + 1];
        goto LAB_00104695;
      }
      place = "";
      if ((opterr != 0) && (*options != ':')) {
        warnx("option requires an argument -- %c",0x57);
      }
      optopt = 0x57;
      iVar3 = optopt;
      goto LAB_00104861;
    }
  }
  if (pcVar4[1] != ':') {
    if (*pcVar2 == '\0') {
      optind = optind + 1;
      return iVar3;
    }
    return iVar3;
  }
  optarg = (char *)0x0;
  if ((*pcVar2 == '\0') && (pcVar2 = optarg, pcVar4[2] != ':')) {
    iVar6 = optind + 1;
    if (nargc <= iVar6) {
      place = "";
      optind = iVar6;
      if ((opterr != 0) && (*options != ':')) {
        warnx("option requires an argument -- %c",iVar3);
      }
LAB_00104861:
      optopt = iVar3;
      return (uint)(*options != ':') * 5 + 0x3a;
    }
    lVar5 = (long)optind;
    optind = iVar6;
    pcVar2 = nargv[lVar5 + 1];
  }
  optarg = pcVar2;
  place = "";
  optind = optind + 1;
  return iVar3;
}

Assistant:

static int
getopt_internal(int nargc, char * const * nargv, const char * options,
				const struct option * long_options, int * idx, int flags) {
	char * oli;				/* option letter list index */
	int optchar, short_too;
	static int posixly_correct = -1;

	if (options == NULL) {
		return (-1);
	}

	/*
	 * Disable GNU extensions if POSIXLY_CORRECT is set or options
	 * string begins with a '+'.
	 */
	if (posixly_correct == -1) {
		posixly_correct = (getenv("POSIXLY_CORRECT") != NULL);
	}

	if (posixly_correct || *options == '+') {
		flags &= ~FLAG_PERMUTE;
	} else if (*options == '-') {
		flags |= FLAG_ALLARGS;
	}

	if (*options == '+' || *options == '-') {
		options++;
	}

	/*
	 * XXX Some GNU programs (like cvs) set optind to 0 instead of
	 * XXX using optreset.  Work around this braindamage.
	 */
	if (optind == 0) {
		optind = optreset = 1;
	}

	optarg = NULL;

	if (optreset) {
		nonopt_start = nonopt_end = -1;
	}

start:

	if (optreset || !*place) {		/* update scanning pointer */
		optreset = 0;

		if (optind >= nargc) {          /* end of argument vector */
			place = EMSG;

			if (nonopt_end != -1) {
				/* do permutation, if we have to */
				permute_args(nonopt_start, nonopt_end,
							 optind, nargv);
				optind -= nonopt_end - nonopt_start;
			} else if (nonopt_start != -1) {
				/*
				 * If we skipped non-options, set optind
				 * to the first of them.
				 */
				optind = nonopt_start;
			}

			nonopt_start = nonopt_end = -1;
			return (-1);
		}

		if (*(place = nargv[optind]) != '-' ||
				(place[1] == '\0' && strchr(options, '-') == NULL)) {
			place = EMSG;		/* found non-option */

			if (flags & FLAG_ALLARGS) {
				/*
				 * GNU extension:
				 * return non-option as argument to option 1
				 */
				optarg = nargv[optind++];
				return (INORDER);
			}

			if (!(flags & FLAG_PERMUTE)) {
				/*
				 * If no permutation wanted, stop parsing
				 * at first non-option.
				 */
				return (-1);
			}

			/* do permutation */
			if (nonopt_start == -1) {
				nonopt_start = optind;
			} else if (nonopt_end != -1) {
				permute_args(nonopt_start, nonopt_end,
							 optind, nargv);
				nonopt_start = optind -
							   (nonopt_end - nonopt_start);
				nonopt_end = -1;
			}

			optind++;
			/* process next argument */
			goto start;
		}

		if (nonopt_start != -1 && nonopt_end == -1) {
			nonopt_end = optind;
		}

		/*
		 * If we have "-" do nothing, if "--" we are done.
		 */
		if (place[1] != '\0' && *++place == '-' && place[1] == '\0') {
			optind++;
			place = EMSG;

			/*
			 * We found an option (--), so if we skipped
			 * non-options, we have to permute.
			 */
			if (nonopt_end != -1) {
				permute_args(nonopt_start, nonopt_end,
							 optind, nargv);
				optind -= nonopt_end - nonopt_start;
			}

			nonopt_start = nonopt_end = -1;
			return (-1);
		}
	}

	/*
	 * Check long options if:
	 *  1) we were passed some
	 *  2) the arg is not just "-"
	 *  3) either the arg starts with -- we are getopt_long_only()
	 */
	if (long_options != NULL && place != nargv[optind] &&
			(*place == '-' || (flags & FLAG_LONGONLY))) {
		short_too = 0;

		if (*place == '-') {
			place++;    /* --foo long option */
		} else if (*place != ':' && strchr(options, *place) != NULL) {
			short_too = 1;    /* could be short option too */
		}

		optchar = parse_long_options(nargv, options, long_options,
									 idx, short_too);

		if (optchar != -1) {
			place = EMSG;
			return (optchar);
		}
	}

	if ((optchar = (int) * place++) == (int)':' ||
			(optchar == (int)'-' && *place != '\0') ||
			(oli = strchr(options, optchar)) == NULL) {
		/*
		 * If the user specified "-" and  '-' isn't listed in
		 * options, return -1 (non-option) as per POSIX.
		 * Otherwise, it is an unknown option character (or ':').
		 */
		if (optchar == (int)'-' && *place == '\0') {
			return (-1);
		}

		if (!*place) {
			++optind;
		}

		if (PRINT_ERROR) {
			warnx(illoptchar, optchar);
		}

		optopt = optchar;
		return (BADCH);
	}

	if (long_options != NULL && optchar == 'W' && oli[1] == ';') {
		/* -W long-option */
		if (*place)			/* no space */
			/* NOTHING */;
		else if (++optind >= nargc) {	/* no arg */
			place = EMSG;

			if (PRINT_ERROR) {
				warnx(recargchar, optchar);
			}

			optopt = optchar;
			return (BADARG);
		} else {			/* white space */
			place = nargv[optind];
		}

		optchar = parse_long_options(nargv, options, long_options,
									 idx, 0);
		place = EMSG;
		return (optchar);
	}

	if (*++oli != ':') {			/* doesn't take argument */
		if (!*place) {
			++optind;
		}
	} else {				/* takes (optional) argument */
		optarg = NULL;

		if (*place) {		/* no white space */
			optarg = place;
		} else if (oli[1] != ':') {	/* arg not optional */
			if (++optind >= nargc) {	/* no arg */
				place = EMSG;

				if (PRINT_ERROR) {
					warnx(recargchar, optchar);
				}

				optopt = optchar;
				return (BADARG);
			} else {
				optarg = nargv[optind];
			}
		}

		place = EMSG;
		++optind;
	}

	/* dump back option letter */
	return (optchar);
}